

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

void do_hide_dialog_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object window;
  Am_Object obj;
  Am_Object local_18;
  Am_Object local_10;
  
  local_10.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((ushort)&local_18,(ulong)cmd);
  Am_Object::operator=(&local_10,&local_18);
  Am_Object::~Am_Object(&local_18);
  local_18.data = (Am_Object_Data *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_10,0x68);
  Am_Object::operator=(&local_18,pAVar1);
  Am_Object::Set((ushort)&local_18,true,0);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_10);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_hide_dialog, (Am_Object cmd))
{
  Am_Object obj; // the cancel button
  obj = cmd.Get_Owner();
  Am_Object window;
  window = obj.Get(Am_WINDOW);
  window.Set(Am_VISIBLE, false);
}